

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[66],kj::ArrayPtr<char_const>,kj::ArrayPtr<char>>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [66],
               ArrayPtr<const_char> *params_1,ArrayPtr<char> *params_2)

{
  undefined4 in_register_00000014;
  ArrayPtr<const_char> *params_00;
  ArrayPtr<char> *params_01;
  long lVar1;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  String local_60;
  String local_48;
  
  str<char_const(&)[66]>
            ((String *)&stack0xffffffffffffff88,(kj *)params,
             (char (*) [66])CONCAT44(in_register_00000014,severity));
  str<kj::ArrayPtr<char_const>&>(&local_60,(kj *)params_1,params_00);
  str<kj::ArrayPtr<char>&>(&local_48,(kj *)params_2,params_01);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff88,in_stack_ffffffffffffff88);
  lVar1 = 0x30;
  do {
    Array<char>::~Array((Array<char> *)(&stack0xffffffffffffff88 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}